

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O0

int dropt_strnicmp(dropt_char *s,dropt_char *t,size_t n)

{
  int iVar1;
  int iVar2;
  size_t local_28;
  size_t n_local;
  dropt_char *t_local;
  dropt_char *s_local;
  
  if (s == (dropt_char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x10e,"int dropt_strnicmp(const dropt_char *, const dropt_char *, size_t)");
  }
  if (t == (dropt_char *)0x0) {
    __assert_fail("t != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x10f,"int dropt_strnicmp(const dropt_char *, const dropt_char *, size_t)");
  }
  local_28 = n;
  n_local = (size_t)t;
  t_local = s;
  if (s != t) {
    for (; (local_28 != 0 && ((*t_local != '\0' || (*(char *)n_local != '\0'))));
        n_local = n_local + 1) {
      if (*t_local != *(char *)n_local) {
        iVar1 = tolower((int)*t_local);
        iVar2 = tolower((int)*(char *)n_local);
        if (iVar1 != iVar2) {
          iVar1 = tolower((int)*t_local);
          iVar2 = tolower((int)*(char *)n_local);
          if (iVar1 < iVar2) {
            return -1;
          }
          return 1;
        }
      }
      t_local = t_local + 1;
      local_28 = local_28 - 1;
    }
  }
  return 0;
}

Assistant:

int
dropt_strnicmp(const dropt_char* s, const dropt_char* t, size_t n)
{
    assert(s != NULL);
    assert(t != NULL);

    if (s == t) { return 0; }

    while (n--)
    {
        if (*s == DROPT_TEXT_LITERAL('\0') && *t == DROPT_TEXT_LITERAL('\0'))
        {
            break;
        }
        else if (*s == *t || dropt_tolower(*s) == dropt_tolower(*t))
        {
            s++;
            t++;
        }
        else
        {
            return (dropt_tolower(*s) < dropt_tolower(*t))
                   ? -1
                   : +1;
        }
    }

    return 0;
}